

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O2

Ref cashew::ValueBuilder::makePtrShift(Ref ptr,int shifts)

{
  size_t sVar1;
  Ref RVar2;
  Ref RVar3;
  Ref in_R8;
  IString op;
  
  sVar1 = DAT_01175390;
  RVar3.inst = RSHIFT.inst;
  RVar2 = makeInt(shifts);
  op.str._M_str = (char *)RVar2.inst;
  op.str._M_len = sVar1;
  RVar3 = makeBinary(ptr.inst,RVar3,op,in_R8);
  return (Ref)RVar3.inst;
}

Assistant:

static Ref makePtrShift(Ref ptr, int shifts) {
    return makeBinary(ptr, RSHIFT, makeInt(shifts));
  }